

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O0

HTS_Boolean HTS_Engine_generate_state_sequence(HTS_Engine *engine)

{
  HTS_Boolean HVar1;
  size_t sVar2;
  long in_RDI;
  double dVar3;
  double f;
  size_t model_index;
  size_t state_index;
  size_t i;
  double **in_stack_000000e8;
  double *in_stack_000000f0;
  double in_stack_000000f8;
  HTS_Boolean in_stack_00000107;
  HTS_Label *in_stack_00000108;
  HTS_ModelSet *in_stack_00000110;
  HTS_SStreamSet *in_stack_00000118;
  double **in_stack_00000130;
  size_t vector_index;
  ulong in_stack_ffffffffffffffc0;
  ulong stream_index;
  HTS_Engine *in_stack_ffffffffffffffd0;
  ulong local_20;
  ulong local_18;
  HTS_Boolean local_1;
  
  vector_index = *(size_t *)(in_RDI + 0x80);
  HVar1 = HTS_SStreamSet_create
                    (in_stack_00000118,in_stack_00000110,in_stack_00000108,in_stack_00000107,
                     in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_00000130);
  if (HVar1 == '\x01') {
    if ((*(double *)(in_RDI + 0x68) != 0.0) || (NAN(*(double *)(in_RDI + 0x68)))) {
      local_20 = 0;
      local_18 = 0;
      while (stream_index = local_18, sVar2 = HTS_Engine_get_total_state((HTS_Engine *)0x1031ee),
            stream_index < sVar2) {
        dVar3 = HTS_Engine_get_state_mean
                          (in_stack_ffffffffffffffd0,stream_index,in_stack_ffffffffffffffc0,
                           vector_index);
        in_stack_ffffffffffffffd0 =
             (HTS_Engine *)(*(double *)(in_RDI + 0x68) * 0.05776226504666211 + dVar3);
        if (2.995732273553991 <= (double)in_stack_ffffffffffffffd0) {
          if (9.903487552536127 < (double)in_stack_ffffffffffffffd0) {
            in_stack_ffffffffffffffd0 = (HTS_Engine *)0x4023ce95eba4f8b4;
          }
        }
        else {
          in_stack_ffffffffffffffd0 = (HTS_Engine *)0x4007f7427b73e391;
        }
        HTS_Engine_set_state_mean
                  (in_stack_ffffffffffffffd0,stream_index,in_stack_ffffffffffffffc0,vector_index,
                   5.24470939751963e-318);
        local_20 = local_20 + 1;
        in_stack_ffffffffffffffc0 = local_20;
        sVar2 = HTS_Engine_get_nstate((HTS_Engine *)0x1032c7);
        if (sVar2 <= in_stack_ffffffffffffffc0) {
          local_20 = 0;
        }
        local_18 = local_18 + 1;
      }
    }
    local_1 = '\x01';
  }
  else {
    HTS_Engine_refresh((HTS_Engine *)0x10319b);
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

static HTS_Boolean HTS_Engine_generate_state_sequence(HTS_Engine * engine)
{
   size_t i, state_index, model_index;
   double f;

   if (HTS_SStreamSet_create(&engine->sss, &engine->ms, &engine->label, engine->condition.phoneme_alignment_flag, engine->condition.speed, engine->condition.duration_iw, engine->condition.parameter_iw, engine->condition.gv_iw) != TRUE) {
      HTS_Engine_refresh(engine);
      return FALSE;
   }
   if (engine->condition.additional_half_tone != 0.0) {
      state_index = 0;
      model_index = 0;
      for (i = 0; i < HTS_Engine_get_total_state(engine); i++) {
         f = HTS_Engine_get_state_mean(engine, 1, i, 0);
         f += engine->condition.additional_half_tone * HALF_TONE;
         if (f < MIN_LF0)
            f = MIN_LF0;
         else if (f > MAX_LF0)
            f = MAX_LF0;
         HTS_Engine_set_state_mean(engine, 1, i, 0, f);
         state_index++;
         if (state_index >= HTS_Engine_get_nstate(engine)) {
            state_index = 0;
            model_index++;
         }
      }
   }
   return TRUE;
}